

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcs.c
# Opt level: O3

void mcswrt(mcscxdef *ctx,mcsdsdef *desc,uchar *buf,ushort bufl)

{
  bool bVar1;
  int iVar2;
  size_t sVar3;
  undefined6 in_register_0000000a;
  bool bVar4;
  
  desc->mcsdsosz = bufl;
  bVar4 = true;
  while( true ) {
    iVar2 = fseek((FILE *)ctx->mcscxfp,desc->mcsdsptr,0);
    if (iVar2 != 0) {
      errsigf(ctx->mcscxerr,"TADS",2);
    }
    sVar3 = fwrite(buf,CONCAT62(in_register_0000000a,bufl) & 0xffffffff,1,(FILE *)ctx->mcscxfp);
    if (sVar3 == 1) break;
    mcscompact(ctx);
    bVar1 = !bVar4;
    bVar4 = false;
    if (bVar1) {
      errsigf(ctx->mcscxerr,"TADS",7);
    }
  }
  return;
}

Assistant:

void mcswrt(mcscxdef *ctx, mcsdsdef *desc, uchar *buf, ushort bufl)
{
    int tries;
    
    desc->mcsdsosz = bufl;
    
    for (tries = 0 ; tries < 2 ; ++tries)
    {
        /* attempt to write the object to the swap file */
        if (osfseek(ctx->mcscxfp, desc->mcsdsptr, OSFSK_SET))
            errsig(ctx->mcscxerr, ERR_FSEEK);
        if (!osfwb(ctx->mcscxfp, buf, (size_t)bufl))
            return;
        
        /* couldn't write it; compact the swap file */
        mcscompact(ctx);
    }
    
    /* couldn't write to swap file, even after compacting it */
    errsig(ctx->mcscxerr, ERR_FWRITE);
}